

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_x509.cc
# Opt level: O1

X509 * d2i_X509_AUX(X509 **a,uchar **pp,long length)

{
  bool bVar1;
  X509 *a_00;
  X509_CERT_AUX *pXVar2;
  uchar *q;
  uchar *local_30;
  
  local_30 = *pp;
  if ((a == (X509 **)0x0) || (bVar1 = true, *a == (X509 *)0x0)) {
    bVar1 = false;
  }
  a_00 = d2i_X509(a,&local_30,length);
  if (a_00 == (X509 *)0x0) {
LAB_002b04ef:
    a_00 = (X509 *)0x0;
  }
  else {
    if (0 < (long)(*pp + (length - (long)local_30))) {
      pXVar2 = d2i_X509_CERT_AUX((X509_CERT_AUX **)&a_00->altname,&local_30,
                                 (long)(*pp + (length - (long)local_30)));
      if (pXVar2 == (X509_CERT_AUX *)0x0) {
        if (!bVar1) {
          X509_free(a_00);
          if (a != (X509 **)0x0) {
            *a = (X509 *)0x0;
          }
        }
        goto LAB_002b04ef;
      }
    }
    *pp = local_30;
  }
  return a_00;
}

Assistant:

X509 *d2i_X509_AUX(X509 **a, const unsigned char **pp, long length) {
  const unsigned char *q = *pp;
  X509 *ret;
  int freeret = 0;

  if (!a || *a == NULL) {
    freeret = 1;
  }
  ret = d2i_X509(a, &q, length);
  // If certificate unreadable then forget it
  if (!ret) {
    return NULL;
  }
  // update length
  length -= q - *pp;
  // Parse auxiliary information if there is any.
  if (length > 0 && !d2i_X509_CERT_AUX(&ret->aux, &q, length)) {
    goto err;
  }
  *pp = q;
  return ret;
err:
  if (freeret) {
    X509_free(ret);
    if (a) {
      *a = NULL;
    }
  }
  return NULL;
}